

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::OutputXmlCDataSection(ostream *stream,char *data)

{
  long lVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::operator<<(stream,"<![CDATA[");
  while( true ) {
    pcVar2 = strstr(data,"]]>");
    if (pcVar2 == (char *)0x0) break;
    std::ostream::write((char *)stream,(long)data);
    std::operator<<(stream,"]]>]]&gt;<![CDATA[");
    data = pcVar2 + 3;
  }
  std::operator<<(stream,data);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::operator<<(stream,"]]>");
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlCDataSection(::std::ostream* stream,
                                                     const char* data) {
  const char* segment = data;
  *stream << "<![CDATA[";
  for (;;) {
    const char* const next_segment = strstr(segment, "]]>");
    if (next_segment != NULL) {
      stream->write(
          segment, static_cast<std::streamsize>(next_segment - segment));
      *stream << "]]>]]&gt;<![CDATA[";
      segment = next_segment + strlen("]]>");
    } else {
      *stream << segment;
      break;
    }
  }
  *stream << "]]>";
}